

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O1

WavelengthUnit __thiscall
FileParse::enumFromStringCaseInsensitive<BSDFData::WavelengthUnit,3ul>
          (FileParse *this,string_view name,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *values,WavelengthUnit defaultValue)

{
  long lVar1;
  long *plVar2;
  size_t sVar3;
  int iVar4;
  WavelengthUnit WVar5;
  size_t sVar6;
  size_t i;
  long lVar7;
  bool bVar8;
  string lowerName;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  WVar5 = (WavelengthUnit)values;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,name._M_len,this + name._M_len);
  sVar3 = local_68;
  plVar2 = local_70;
  if (local_68 != 0) {
    sVar6 = 0;
    do {
      iVar4 = tolower((uint)*(byte *)((long)plVar2 + sVar6));
      *(char *)((long)plVar2 + sVar6) = (char)iVar4;
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  lVar7 = 0;
  while( true ) {
    lVar1 = *(long *)(name._M_str + lVar7 * 0x20);
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,lVar1,*(long *)(name._M_str + lVar7 * 0x20 + 8) + lVar1);
    sVar3 = local_48;
    plVar2 = local_50;
    if (local_48 != 0) {
      sVar6 = 0;
      do {
        iVar4 = tolower((uint)*(byte *)((long)plVar2 + sVar6));
        *(char *)((long)plVar2 + sVar6) = (char)iVar4;
        sVar6 = sVar6 + 1;
      } while (sVar3 != sVar6);
    }
    if (local_48 == local_68) {
      if (local_48 == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp(local_50,local_70,local_48);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar8) break;
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
LAB_00195ee2:
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      return WVar5;
    }
  }
  WVar5 = (WavelengthUnit)lVar7;
  goto LAB_00195ee2;
}

Assistant:

EnumType enumFromStringCaseInsensitive(std::string_view name,
                                           const std::array<std::string, N> & values,
                                           EnumType defaultValue)
    {
        std::string lowerName = toLower(name);
        for(std::size_t i = 0; i < values.size(); ++i)
        {
            if(toLower(values[i]) == lowerName)
            {
                return static_cast<EnumType>(i);
            }
        }

        return defaultValue;
    }